

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O2

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *blindout,uint64_t *value_out,uchar *message_out,size_t *outlen,uchar *nonce,
              uint64_t *min_value,uint64_t *max_value,secp256k1_ge *commit,uchar *proof,size_t plen,
              uchar *extra_commit,size_t extra_commit_len,secp256k1_ge *genp)

{
  uchar *b32;
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  secp256k1_scalar *psVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  uchar *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t rings;
  uint64_t value;
  long local_87e8;
  int local_87d0;
  int overflow;
  int mantissa;
  int exp;
  ulong local_8788;
  uchar *local_8780;
  byte local_8778;
  undefined7 uStack_8777;
  long lStack_8770;
  long local_8768;
  long lStack_8760;
  size_t local_8758;
  uint64_t *local_8750;
  uint64_t scale;
  size_t local_8740;
  secp256k1_scalar blind;
  secp256k1_scalar stmp;
  uchar signs [31];
  secp256k1_ge c;
  uchar m [33];
  secp256k1_gej accj;
  size_t rsizes [32];
  secp256k1_sha256 local_84c8;
  secp256k1_scalar stmp_1;
  secp256k1_scalar sec [32];
  secp256k1_scalar s [128];
  secp256k1_fe fe;
  secp256k1_scalar evalues [128];
  uchar local_5038 [4096];
  secp256k1_gej pubs [128];
  
  local_8740 = 0;
  iVar2 = secp256k1_rangeproof_getheader_impl
                    (&local_8740,&exp,&mantissa,&scale,min_value,max_value,proof,plen);
  sVar10 = local_8740;
  if (iVar2 == 0) {
    return 0;
  }
  rsizes[0] = 1;
  if (mantissa == 0) {
    uVar4 = 1;
    rings = uVar4;
  }
  else {
    rings = (size_t)(mantissa >> 1);
    for (sVar3 = 0; rings != sVar3; sVar3 = sVar3 + 1) {
      rsizes[sVar3] = 4;
    }
    uVar4 = (ulong)(int)(mantissa * 2 & 0xfffffffc);
    if ((mantissa & 1U) != 0) {
      rsizes[rings] = 2;
      uVar4 = uVar4 | 2;
      rings = rings + 1;
    }
  }
  uVar11 = rings + 6 >> 3;
  if (plen - local_8740 < (uVar4 + rings) * 0x20 + uVar11) {
    return 0;
  }
  local_84c8.s[0] = 0x6a09e667;
  local_84c8.s[1] = 0xbb67ae85;
  local_84c8.s[2] = 0x3c6ef372;
  local_84c8.s[3] = 0xa54ff53a;
  local_84c8.s[4] = 0x510e527f;
  local_84c8.s[5] = 0x9b05688c;
  local_84c8.s[6] = 0x1f83d9ab;
  local_84c8.s[7] = 0x5be0cd19;
  local_84c8.bytes = 0;
  local_8780 = message_out;
  secp256k1_rangeproof_serialize_point(m,commit);
  secp256k1_sha256_write(&local_84c8,m,0x21);
  secp256k1_rangeproof_serialize_point(m,genp);
  secp256k1_sha256_write(&local_84c8,m,0x21);
  secp256k1_sha256_write(&local_84c8,proof,sVar10);
  uVar4 = rings - 1;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    signs[uVar5] = (proof[(uVar5 >> 3) + sVar10] >> ((uint)uVar5 & 7) & 1) != 0;
  }
  lVar12 = uVar11 + sVar10;
  if (((uVar4 & 7) != 0) && (proof[lVar12 + -1] >> (sbyte)(uVar4 & 7) != 0)) {
    return 0;
  }
  local_8750 = value_out;
  secp256k1_gej_set_infinity(&accj);
  if (*min_value != 0) {
    secp256k1_pedersen_ecmult_small(&accj,*min_value,genp);
  }
  lVar15 = -lVar12;
  puVar13 = proof + lVar12;
  local_87e8 = 0;
  for (lVar12 = 0; lVar15 = lVar15 + -0x20, (1 - rings) + lVar12 != 0; lVar12 = lVar12 + 1) {
    iVar2 = secp256k1_fe_set_b32(&fe,puVar13);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = secp256k1_ge_set_xquad(&c,&fe);
    if (iVar2 == 0) {
      return 0;
    }
    if (signs[lVar12] != '\0') {
      secp256k1_ge_neg(&c,&c);
    }
    secp256k1_sha256_write(&local_84c8,signs + lVar12,1);
    secp256k1_sha256_write(&local_84c8,puVar13,0x20);
    pubs[local_87e8].infinity = c.infinity;
    pubs[local_87e8].x.n[0] = c.x.n[0];
    pubs[local_87e8].x.n[1] = c.x.n[1];
    pubs[local_87e8].x.n[2] = c.x.n[2];
    pubs[local_87e8].x.n[3] = c.x.n[3];
    pubs[local_87e8].x.n[4] = c.x.n[4];
    pubs[local_87e8].y.n[0] = c.y.n[0];
    pubs[local_87e8].y.n[1] = c.y.n[1];
    pubs[local_87e8].y.n[2] = c.y.n[2];
    pubs[local_87e8].y.n[3] = c.y.n[3];
    pubs[local_87e8].y.n[4] = c.y.n[4];
    pubs[local_87e8].z.n[0] = 1;
    pubs[local_87e8].z.n[3] = 0;
    pubs[local_87e8].z.n[4] = 0;
    pubs[local_87e8].z.n[1] = 0;
    pubs[local_87e8].z.n[2] = 0;
    secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
    local_87e8 = local_87e8 + rsizes[lVar12];
    puVar13 = puVar13 + 0x20;
  }
  secp256k1_gej_neg(&accj,&accj);
  secp256k1_gej_add_ge_var(pubs + local_87e8,&accj,commit,(secp256k1_fe *)0x0);
  if (pubs[local_87e8].infinity == 0) {
    sVar3 = -lVar15;
    secp256k1_rangeproof_pub_expand(pubs,exp,rsizes,rings,genp);
    lVar12 = *(long *)((long)(&accj.z + 1) + rings * 2 * 4);
    lVar15 = lVar12 + local_87e8 + 1;
    psVar9 = s;
    do {
      lVar15 = lVar15 + -1;
      if (lVar15 == 0) {
        if (plen != sVar3) {
          return 0;
        }
        if (extra_commit != (uchar *)0x0) {
          secp256k1_sha256_write(&local_84c8,extra_commit,extra_commit_len);
        }
        secp256k1_sha256_finalize(&local_84c8,m);
        psVar9 = evalues;
        if (nonce == (uchar *)0x0) {
          psVar9 = (secp256k1_scalar *)0x0;
        }
        iVar2 = secp256k1_borromean_verify(ecmult_ctx,psVar9,puVar13,s,pubs,rsizes,rings,m,0x20);
        if (nonce == (uchar *)0x0) {
          return iVar2;
        }
        if (iVar2 == 0) {
          return 0;
        }
        if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
          return 0;
        }
        local_87d0 = (int)sVar10;
        memset(local_5038,0,0x1000);
        secp256k1_rangeproof_genrand
                  (sec,(secp256k1_scalar *)&fe,local_5038,rsizes,rings,nonce,commit,proof,
                   (long)local_87d0,genp);
        blind.d[0] = 0;
        blind.d[1] = 0;
        blind.d[2] = 0;
        blind.d[3] = 0;
        if ((rings != 1) || (rsizes[0] != 1)) {
          uVar5 = -lVar12;
          lVar15 = lVar12 * 0x20 + rings * 0x80;
          lVar7 = 0;
          goto LAB_00119781;
        }
        secp256k1_rangeproof_recover_x(&blind,(secp256k1_scalar *)&fe,evalues,s);
        uVar11 = 0;
        goto joined_r0x00119aa8;
      }
      b32 = proof + sVar3;
      sVar3 = sVar3 + 0x20;
      secp256k1_scalar_set_b32(psVar9,b32,&overflow);
      psVar9 = psVar9 + 1;
    } while (overflow == 0);
  }
  return 0;
LAB_00119781:
  if (lVar7 == -0x40) goto LAB_001197d3;
  secp256k1_scalar_get_b32
            (&local_8778,(secp256k1_scalar *)((long)s[rings * 4 + lVar12 + -5].d + lVar7));
  secp256k1_rangeproof_ch32xor(&local_8778,local_5038 + lVar7 + lVar15 + -0xa0);
  if ((((char)local_8778 < '\0') && (local_8768 == lStack_8760)) && (lStack_8770 == local_8768)) {
    puVar13 = local_5038 + lVar7 + lVar15 + -0xa0;
    uVar11 = 0;
    for (lVar12 = 0x18; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      uVar11 = uVar11 << 8 | (ulong)(&local_8778)[lVar12];
    }
    *(long *)(puVar13 + 0x10) = local_8768;
    *(long *)(puVar13 + 0x18) = lStack_8760;
    *(ulong *)puVar13 = CONCAT71(uStack_8777,local_8778);
    *(long *)(puVar13 + 8) = lStack_8770;
    local_8788 = (ulong)((uint)(uVar11 >> ((char)uVar4 * '\x02' & 0x3fU)) & 3);
    if (~local_8788 != uVar5) {
      local_8788 = local_8788 | uVar4 * 4;
      secp256k1_rangeproof_recover_x
                (&stmp,(secp256k1_scalar *)(fe.n + local_8788 * 4),evalues + local_8788,
                 s + local_8788);
      psVar9 = sec + uVar4;
      secp256k1_scalar_negate(psVar9,psVar9);
      secp256k1_scalar_add(&blind,&stmp,psVar9);
      if (outlen == (size_t *)0x0 || local_8780 == (uchar *)0x0) {
joined_r0x00119aa8:
        if (outlen == (size_t *)0x0) goto LAB_00119694;
      }
      else if (*outlen != 0) {
        uVar8 = 0;
        uVar16 = 0;
        sVar10 = 0;
        uVar4 = local_8788;
        while (sVar10 != rings) {
          local_8758 = sVar10;
          uVar1 = rsizes[sVar10];
          for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
            uVar6 = uVar8;
            if (((rings * 4 - uVar5) - 5 != uVar16) && (uVar16 != uVar4)) {
              if (((uint)(uVar11 >> ((char)sVar10 * '\x02' & 0x3fU)) & 3) == uVar14) {
                secp256k1_scalar_mul(&stmp_1,sec + sVar10,evalues + uVar16);
                uVar4 = local_8788;
                secp256k1_scalar_add(&stmp,s + uVar16,&stmp_1);
              }
              else {
                stmp.d[0] = s[uVar16].d[0];
                stmp.d[1] = s[uVar16].d[1];
                stmp.d[2] = s[uVar16].d[2];
                stmp.d[3] = s[uVar16].d[3];
              }
              secp256k1_scalar_get_b32(&local_8778,&stmp);
              secp256k1_rangeproof_ch32xor(&local_8778,local_5038 + uVar16 * 0x20);
              for (lVar12 = 0; (uVar6 = lVar12 + uVar8, lVar12 != 0x20 && (uVar6 < *outlen));
                  lVar12 = lVar12 + 1) {
                local_8780[lVar12 + uVar8] = (&local_8778)[lVar12];
              }
            }
            uVar16 = uVar16 + 1;
            uVar8 = uVar6;
          }
          sVar10 = local_8758 + 1;
        }
        *outlen = uVar8;
        for (lVar12 = 0; lVar12 != 0x1000; lVar12 = lVar12 + 0x20) {
          *(undefined8 *)((long)fe.n + lVar12 + 0x10) = 0;
          *(undefined8 *)((long)fe.n + lVar12 + 0x18) = 0;
          *(undefined8 *)((long)fe.n + lVar12) = 0;
          *(undefined8 *)((long)fe.n + lVar12 + 8) = 0;
        }
        for (lVar12 = 0; lVar12 != 0x400; lVar12 = lVar12 + 0x20) {
          *(undefined8 *)((long)sec[0].d + lVar12 + 0x10) = 0;
          *(undefined8 *)((long)sec[0].d + lVar12 + 0x18) = 0;
          *(undefined8 *)((long)sec[0].d + lVar12) = 0;
          *(undefined8 *)((long)sec[0].d + lVar12 + 8) = 0;
        }
        goto LAB_00119694;
      }
      *outlen = 0;
LAB_00119694:
      value = uVar11 * scale + *min_value;
      secp256k1_pedersen_ecmult(ecmult_gen_ctx,&accj,&blind,value,genp);
      if (accj.infinity != 0) {
        return 0;
      }
      secp256k1_gej_neg(&accj,&accj);
      secp256k1_gej_add_ge_var(&accj,&accj,commit,(secp256k1_fe *)0x0);
      if (accj.infinity == 0) {
        return 0;
      }
      if (blindout != (uchar *)0x0) {
        secp256k1_scalar_get_b32(blindout,&blind);
      }
      if (local_8750 != (uint64_t *)0x0) {
        *local_8750 = value;
        return iVar2;
      }
      return iVar2;
    }
LAB_001197d3:
    if (outlen == (size_t *)0x0) {
      return 0;
    }
    *outlen = 0;
    return 0;
  }
  uVar5 = uVar5 + 1;
  lVar7 = lVar7 + -0x20;
  goto LAB_00119781;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_context* ecmult_ctx,
 const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_pedersen_ecmult_small(&accj, *min_value, genp);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(ecmult_ctx, nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(ecmult_gen_ctx, &accj, &blind, vv, genp);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}